

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_same_stdout_stderr(void)

{
  int iVar1;
  __uid_t _Var2;
  uint uVar3;
  int extraout_EAX;
  undefined8 uVar4;
  undefined1 *puVar5;
  anon_union_8_2_13e1ed65_for_data aVar6;
  uv_exit_cb p_Var7;
  uv_process_options_t *__nmemb;
  passwd *ppVar8;
  uv_process_options_t *puVar9;
  int *piVar10;
  uv_process_options_t *__ptr;
  uv_buf_t *buf;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *__s;
  uv_process_options_t *puVar11;
  undefined1 auVar12 [16];
  int64_t eval_b;
  int64_t eval_b_2;
  uv_write_t write_req;
  uv_stdio_container_t stdio [3];
  uv_pipe_t out;
  uv_pipe_t in;
  undefined1 auStack_f08 [48];
  uv_handle_t *apuStack_ed8 [11];
  uv_loop_t *puStack_e80;
  undefined8 auStack_d18 [29];
  uv_stdio_container_t uStack_c30;
  undefined4 uStack_c20;
  undefined4 uStack_c10;
  uv_process_options_t *puStack_bf8;
  long lStack_bc0;
  uint uStack_bb8;
  int iStack_bb4;
  undefined1 auStack_bb0 [16];
  undefined8 uStack_ba0;
  undefined2 uStack_b98;
  uv_stdio_container_t uStack_b90;
  long alStack_b78 [25];
  long alStack_ab0 [25];
  long alStack_9e8 [29];
  undefined1 auStack_900 [88];
  uint uStack_8a8;
  uv_process_options_t *puStack_740;
  uv_process_options_t *puStack_738;
  uv_process_options_t *puStack_730;
  long lStack_728;
  long lStack_720;
  uv_process_options_t *puStack_718;
  char cStack_701;
  long lStack_700;
  long lStack_6f8;
  uv_process_options_t *puStack_6f0;
  uv_process_options_t *puStack_6e8;
  uv_process_options_t *apuStack_6e0 [2];
  uv_process_options_t *puStack_6d0;
  cpu_set_t cStack_6c8;
  uv_process_options_t *puStack_640;
  char *pcStack_638;
  uv_process_options_t *puStack_630;
  uv_process_options_t *puStack_628;
  long lStack_620;
  long lStack_618;
  uv_process_options_t *puStack_610;
  long lStack_608;
  long lStack_600;
  uv_process_options_t *puStack_5f8;
  long lStack_5f0;
  long lStack_5e8;
  char acStack_5d2 [10];
  uv_process_options_t *puStack_5c8;
  sigset_t sStack_598;
  anon_union_8_2_13e1ed65_for_data aStack_518;
  long lStack_510;
  long lStack_508;
  undefined1 auStack_500 [16];
  uv_stdio_container_t auStack_4f0 [2];
  long alStack_4c8 [25];
  undefined1 auStack_400 [232];
  undefined1 *puStack_318;
  anon_union_8_2_13e1ed65_for_data aStack_310;
  long local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  long local_2e0 [25];
  uv_stdio_container_t local_218;
  undefined4 local_208;
  undefined1 *local_200;
  undefined1 local_1e8 [232];
  undefined1 local_100 [232];
  
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1919;
  init_process_options("spawn_helper3",exit_cb);
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c192a;
  local_2f0 = uv_buf_init("TEST",4);
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1939;
  uVar4 = uv_default_loop();
  puVar5 = local_1e8;
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c194e;
  uv_pipe_init(uVar4,puVar5,0);
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1953;
  uVar4 = uv_default_loop();
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1968;
  uv_pipe_init(uVar4,(uv_stream_t *)local_100,0);
  options.stdio = &local_218;
  puVar11 = &options;
  local_218.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  local_208 = 0x21;
  options.stdio_count = 2;
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c19a2;
  local_218.data.stream = (uv_stream_t *)local_100;
  local_200 = puVar5;
  uVar4 = uv_default_loop();
  aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c19b4;
  iVar1 = uv_spawn(uVar4,&process,&options);
  local_2e0[0] = (long)iVar1;
  local_300 = 0;
  if (local_2e0[0] == 0) {
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c19e2;
    iVar1 = uv_process_kill(&process,0);
    local_2e0[0] = (long)iVar1;
    local_300 = 0;
    if (local_2e0[0] != 0) goto LAB_001c1b9f;
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1a25;
    iVar1 = uv_write(local_2e0,local_100,local_2f0,1,write_cb);
    local_300 = (long)iVar1;
    local_2f8 = 0;
    if (local_300 != 0) goto LAB_001c1bae;
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1a60;
    iVar1 = uv_read_start(local_1e8,on_alloc,on_read);
    local_300 = (long)iVar1;
    local_2f8 = 0;
    if (local_300 != 0) goto LAB_001c1bbd;
    local_300 = (long)exit_cb_called;
    local_2f8 = 0;
    if (local_300 != 0) goto LAB_001c1bcc;
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1aaa;
    uVar4 = uv_default_loop();
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1ab4;
    iVar1 = uv_run(uVar4,0);
    local_300 = (long)iVar1;
    local_2f8 = 0;
    if (local_300 != 0) goto LAB_001c1bdb;
    local_300 = 1;
    local_2f8 = (long)exit_cb_called;
    if (local_2f8 != 1) goto LAB_001c1bea;
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b0c;
    iVar1 = strcmp(output,"TEST");
    local_300 = (long)iVar1;
    local_2f8 = 0;
    if (local_300 != 0) goto LAB_001c1bf9;
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b31;
    puVar5 = (undefined1 *)uv_default_loop();
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b45;
    uv_walk(puVar5,close_walk_cb,0);
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b4f;
    uv_run(puVar5,0);
    local_300 = 0;
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b5d;
    uVar4 = uv_default_loop();
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b65;
    iVar1 = uv_loop_close(uVar4);
    local_2f8 = (long)iVar1;
    if (local_300 == local_2f8) {
      aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b81;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1b9f;
    run_test_spawn_same_stdout_stderr_cold_1();
LAB_001c1b9f:
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1bae;
    run_test_spawn_same_stdout_stderr_cold_2();
LAB_001c1bae:
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1bbd;
    run_test_spawn_same_stdout_stderr_cold_3();
LAB_001c1bbd:
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1bcc;
    run_test_spawn_same_stdout_stderr_cold_4();
LAB_001c1bcc:
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1bdb;
    run_test_spawn_same_stdout_stderr_cold_5();
LAB_001c1bdb:
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1bea;
    run_test_spawn_same_stdout_stderr_cold_6();
LAB_001c1bea:
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1bf9;
    run_test_spawn_same_stdout_stderr_cold_7();
LAB_001c1bf9:
    aStack_310 = (anon_union_8_2_13e1ed65_for_data)0x1c1c08;
    run_test_spawn_same_stdout_stderr_cold_8();
  }
  aStack_310.stream = (uv_stream_t *)run_test_spawn_closed_process_io;
  run_test_spawn_same_stdout_stderr_cold_9();
  aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1c34;
  puStack_318 = puVar5;
  aStack_310.stream = (uv_stream_t *)local_100;
  init_process_options("spawn_helper3",exit_cb);
  aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1c39;
  uVar4 = uv_default_loop();
  aVar6.stream = (uv_stream_t *)auStack_400;
  aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1c4e;
  uv_pipe_init(uVar4,aVar6.stream,0);
  options.stdio = auStack_4f0;
  __s = &options;
  auStack_4f0[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1c7c;
  auStack_4f0[0].data.stream = aVar6.stream;
  close(0);
  aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1c81;
  uVar4 = uv_default_loop();
  aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1c93;
  iVar1 = uv_spawn(uVar4,&process,&options);
  alStack_4c8[0] = (long)iVar1;
  auStack_500._0_8_ = 0;
  if (alStack_4c8[0] == 0) {
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1cc4;
    auStack_500 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1cf1;
    iVar1 = uv_write(alStack_4c8,auStack_400,auStack_500,1,write_cb);
    lStack_508 = (long)iVar1;
    lStack_510 = 0;
    if (lStack_508 != 0) goto LAB_001c1ded;
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1d14;
    uVar4 = uv_default_loop();
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1d1e;
    iVar1 = uv_run(uVar4,0);
    lStack_508 = (long)iVar1;
    lStack_510 = 0;
    if (lStack_508 != 0) goto LAB_001c1dfa;
    lStack_508 = 1;
    lStack_510 = (long)exit_cb_called;
    if (lStack_510 != 1) goto LAB_001c1e07;
    lStack_508 = 2;
    lStack_510 = (long)close_cb_called;
    if (lStack_510 != 2) goto LAB_001c1e14;
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1d87;
    aVar6.stream = (uv_stream_t *)uv_default_loop();
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1d9b;
    uv_walk(aVar6.stream,close_walk_cb,0);
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1da5;
    uv_run(aVar6.stream,0);
    lStack_508 = 0;
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1db3;
    uVar4 = uv_default_loop();
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1dbb;
    iVar1 = uv_loop_close(uVar4);
    lStack_510 = (long)iVar1;
    if (lStack_508 == lStack_510) {
      aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1dd1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1ded;
    run_test_spawn_closed_process_io_cold_1();
LAB_001c1ded:
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1dfa;
    run_test_spawn_closed_process_io_cold_2();
LAB_001c1dfa:
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1e07;
    run_test_spawn_closed_process_io_cold_3();
LAB_001c1e07:
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1e14;
    run_test_spawn_closed_process_io_cold_4();
LAB_001c1e14:
    aStack_518 = (anon_union_8_2_13e1ed65_for_data)0x1c1e21;
    run_test_spawn_closed_process_io_cold_5();
  }
  aStack_518.stream = (uv_stream_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  aStack_518 = aVar6;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_598);
  sigaddset(&sStack_598,0xf);
  iVar1 = pthread_sigmask(0,&sStack_598,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    sStack_598.__val[0] = 0xffffffffffffffff;
    p_Var7 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x1);
    if ((uv_exit_cb)sStack_598.__val[0] == p_Var7) goto LAB_001c2097;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    sStack_598.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_598.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20a4;
    sigemptyset(&sStack_598);
    sigaddset(&sStack_598,0xf);
    iVar1 = pthread_sigmask(1,&sStack_598,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_001c20b1;
    sStack_598.__val[0] = 0xffffffffffffffff;
    p_Var7 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x0);
    if ((uv_exit_cb)sStack_598.__val[0] == p_Var7) goto LAB_001c20be;
    iVar1 = uv_kill(process.pid,0);
    sStack_598.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_598.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20cb;
    iVar1 = uv_kill(process.pid,0xf);
    sStack_598.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_598.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20d8;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    sStack_598.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_598.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20e5;
    sStack_598.__val[0] = 1;
    if (exit_cb_called != 1) goto LAB_001c20f2;
    sStack_598.__val[0] = 1;
    if (close_cb_called != 1) goto LAB_001c20ff;
    __nmemb = (uv_process_options_t *)uv_default_loop();
    uv_walk(__nmemb,close_walk_cb,0);
    uv_run(__nmemb,0);
    sStack_598.__val[0] = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if ((uv_exit_cb)sStack_598.__val[0] == (uv_exit_cb)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001c2097:
    run_test_kill_cold_11();
LAB_001c20a4:
    run_test_kill_cold_2();
LAB_001c20b1:
    run_test_kill_cold_3();
LAB_001c20be:
    run_test_kill_cold_10();
LAB_001c20cb:
    run_test_kill_cold_4();
LAB_001c20d8:
    run_test_kill_cold_5();
LAB_001c20e5:
    run_test_kill_cold_6();
LAB_001c20f2:
    run_test_kill_cold_7();
LAB_001c20ff:
    __nmemb = (uv_process_options_t *)&sStack_598;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  puStack_5f8 = (uv_process_options_t *)0x1c2129;
  puStack_5c8 = __nmemb;
  _Var2 = getuid();
  if (_Var2 != 0) {
    puStack_5f8 = (uv_process_options_t *)0x1c22e8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  puStack_5f8 = (uv_process_options_t *)0x1c2144;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  puStack_5f8 = (uv_process_options_t *)0x1c2150;
  ppVar8 = getpwnam("nobody");
  if (ppVar8 == (passwd *)0x0) {
    puStack_5f8 = (uv_process_options_t *)0x1c22fb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22fb:
    puStack_5f8 = (uv_process_options_t *)0x1c2308;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c2308:
    puStack_5f8 = (uv_process_options_t *)0x1c2315;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c2315:
    puStack_5f8 = (uv_process_options_t *)0x1c2322;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c2322:
    puStack_5f8 = (uv_process_options_t *)0x1c232f;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar8->pw_uid;
    __nmemb = &options;
    options.gid = ppVar8->pw_gid;
    puVar11 = (uv_process_options_t *)0x1e6b28;
    unaff_R12 = acStack_5d2;
    puStack_5f8 = (uv_process_options_t *)0x1c2198;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar8->pw_uid);
    __s = (uv_process_options_t *)&stack0xfffffffffffffa24;
    puStack_5f8 = (uv_process_options_t *)0x1c21b3;
    snprintf((char *)__s,10,"%d",(ulong)ppVar8->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)__s;
    options.flags = 3;
    puStack_5f8 = (uv_process_options_t *)0x1c21d8;
    uVar4 = uv_default_loop();
    puStack_5f8 = (uv_process_options_t *)0x1c21ea;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 == -0xd) {
      puStack_5f8 = (uv_process_options_t *)0x1c22ef;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_5e8 = (long)iVar1;
    lStack_5f0 = 0;
    if (lStack_5e8 != 0) goto LAB_001c22fb;
    puStack_5f8 = (uv_process_options_t *)0x1c2216;
    uVar4 = uv_default_loop();
    puStack_5f8 = (uv_process_options_t *)0x1c2220;
    iVar1 = uv_run(uVar4,0);
    lStack_5e8 = (long)iVar1;
    lStack_5f0 = 0;
    if (lStack_5e8 != 0) goto LAB_001c2308;
    lStack_5e8 = 1;
    lStack_5f0 = (long)exit_cb_called;
    if (lStack_5f0 != 1) goto LAB_001c2315;
    lStack_5e8 = 1;
    lStack_5f0 = (long)close_cb_called;
    if (lStack_5f0 != 1) goto LAB_001c2322;
    puStack_5f8 = (uv_process_options_t *)0x1c2289;
    __s = (uv_process_options_t *)uv_default_loop();
    __nmemb = (uv_process_options_t *)0x0;
    puStack_5f8 = (uv_process_options_t *)0x1c229f;
    uv_walk(__s,close_walk_cb,0);
    puStack_5f8 = (uv_process_options_t *)0x1c22a9;
    uv_run(__s,0);
    lStack_5e8 = 0;
    puStack_5f8 = (uv_process_options_t *)0x1c22b7;
    uVar4 = uv_default_loop();
    puStack_5f8 = (uv_process_options_t *)0x1c22bf;
    iVar1 = uv_loop_close(uVar4);
    lStack_5f0 = (long)iVar1;
    if (lStack_5e8 == lStack_5f0) {
      puStack_5f8 = (uv_process_options_t *)0x1c22d5;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_5f8 = (uv_process_options_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  puStack_610 = (uv_process_options_t *)0x1c2346;
  puStack_5f8 = __nmemb;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_610 = (uv_process_options_t *)0x1c2356;
    puVar9 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar9 == (uv_process_options_t *)0x0) goto LAB_001c24e5;
    puStack_610 = (uv_process_options_t *)0x1c236a;
    iVar1 = setgid(*(__gid_t *)((long)&puVar9->args + 4));
    lStack_600 = (long)iVar1;
    lStack_608 = 0;
    __nmemb = puVar9;
    if (lStack_600 != 0) goto LAB_001c24ea;
    puStack_610 = (uv_process_options_t *)0x1c2390;
    iVar1 = setuid(*(__uid_t *)&puVar9->args);
    lStack_600 = (long)iVar1;
    lStack_608 = 0;
    if (lStack_600 == 0) goto LAB_001c23ae;
  }
  else {
LAB_001c23ae:
    puStack_610 = (uv_process_options_t *)0x1c23c1;
    init_process_options("spawn_helper1",fail_cb);
    __nmemb = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    puStack_610 = (uv_process_options_t *)0x1c23de;
    uVar4 = uv_default_loop();
    puStack_610 = (uv_process_options_t *)0x1c23f0;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_600 = (long)iVar1;
    lStack_608 = -1;
    if (lStack_600 == -1) {
      puStack_610 = (uv_process_options_t *)0x1c2413;
      uVar4 = uv_default_loop();
      puStack_610 = (uv_process_options_t *)0x1c241d;
      iVar1 = uv_run(uVar4,0);
      lStack_600 = (long)iVar1;
      lStack_608 = 0;
      if (lStack_600 != 0) goto LAB_001c24be;
      lStack_600 = (long)close_cb_called;
      lStack_608 = 0;
      if (lStack_600 != 0) goto LAB_001c24cb;
      puStack_610 = (uv_process_options_t *)0x1c245f;
      __nmemb = (uv_process_options_t *)uv_default_loop();
      puStack_610 = (uv_process_options_t *)0x1c2473;
      uv_walk(__nmemb,close_walk_cb,0);
      puStack_610 = (uv_process_options_t *)0x1c247d;
      uv_run(__nmemb,0);
      lStack_600 = 0;
      puStack_610 = (uv_process_options_t *)0x1c248b;
      uVar4 = uv_default_loop();
      puStack_610 = (uv_process_options_t *)0x1c2493;
      iVar1 = uv_loop_close(uVar4);
      lStack_608 = (long)iVar1;
      if (lStack_600 == lStack_608) {
        puStack_610 = (uv_process_options_t *)0x1c24a9;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_610 = (uv_process_options_t *)0x1c24be;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c24be:
      puStack_610 = (uv_process_options_t *)0x1c24cb;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c24cb:
      puStack_610 = (uv_process_options_t *)0x1c24d8;
      run_test_spawn_setuid_fails_cold_5();
    }
    puStack_610 = (uv_process_options_t *)0x1c24e5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24e5:
    puStack_610 = (uv_process_options_t *)0x1c24ea;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ea:
    puStack_610 = (uv_process_options_t *)0x1c24f7;
    run_test_spawn_setuid_fails_cold_1();
  }
  puStack_610 = (uv_process_options_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  puStack_628 = (uv_process_options_t *)0x1c250e;
  puStack_610 = __nmemb;
  _Var2 = getuid();
  if (_Var2 == 0) {
    puStack_628 = (uv_process_options_t *)0x1c251e;
    puVar9 = (uv_process_options_t *)getpwnam("nobody");
    if (puVar9 == (uv_process_options_t *)0x0) goto LAB_001c26ad;
    puStack_628 = (uv_process_options_t *)0x1c2532;
    iVar1 = setgid(*(__gid_t *)((long)&puVar9->args + 4));
    lStack_618 = (long)iVar1;
    lStack_620 = 0;
    __nmemb = puVar9;
    if (lStack_618 != 0) goto LAB_001c26b2;
    puStack_628 = (uv_process_options_t *)0x1c2558;
    iVar1 = setuid(*(__uid_t *)&puVar9->args);
    lStack_618 = (long)iVar1;
    lStack_620 = 0;
    if (lStack_618 == 0) goto LAB_001c2576;
  }
  else {
LAB_001c2576:
    puStack_628 = (uv_process_options_t *)0x1c2589;
    init_process_options("spawn_helper1",fail_cb);
    __nmemb = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puStack_628 = (uv_process_options_t *)0x1c25a6;
    uVar4 = uv_default_loop();
    puStack_628 = (uv_process_options_t *)0x1c25b8;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_618 = (long)iVar1;
    lStack_620 = -1;
    if (lStack_618 == -1) {
      puStack_628 = (uv_process_options_t *)0x1c25db;
      uVar4 = uv_default_loop();
      puStack_628 = (uv_process_options_t *)0x1c25e5;
      iVar1 = uv_run(uVar4,0);
      lStack_618 = (long)iVar1;
      lStack_620 = 0;
      if (lStack_618 != 0) goto LAB_001c2686;
      lStack_618 = (long)close_cb_called;
      lStack_620 = 0;
      if (lStack_618 != 0) goto LAB_001c2693;
      puStack_628 = (uv_process_options_t *)0x1c2627;
      __nmemb = (uv_process_options_t *)uv_default_loop();
      puStack_628 = (uv_process_options_t *)0x1c263b;
      uv_walk(__nmemb,close_walk_cb,0);
      puStack_628 = (uv_process_options_t *)0x1c2645;
      uv_run(__nmemb,0);
      lStack_618 = 0;
      puStack_628 = (uv_process_options_t *)0x1c2653;
      uVar4 = uv_default_loop();
      puStack_628 = (uv_process_options_t *)0x1c265b;
      iVar1 = uv_loop_close(uVar4);
      lStack_620 = (long)iVar1;
      if (lStack_618 == lStack_620) {
        puStack_628 = (uv_process_options_t *)0x1c2671;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      puStack_628 = (uv_process_options_t *)0x1c2686;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2686:
      puStack_628 = (uv_process_options_t *)0x1c2693;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2693:
      puStack_628 = (uv_process_options_t *)0x1c26a0;
      run_test_spawn_setgid_fails_cold_5();
    }
    puStack_628 = (uv_process_options_t *)0x1c26ad;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c26ad:
    puStack_628 = (uv_process_options_t *)0x1c26b2;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c26b2:
    puStack_628 = (uv_process_options_t *)0x1c26bf;
    run_test_spawn_setgid_fails_cold_1();
  }
  puStack_628 = (uv_process_options_t *)run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  puStack_6f0 = (uv_process_options_t *)0x1c26df;
  puStack_640 = __nmemb;
  pcStack_638 = unaff_R12;
  puStack_630 = __s;
  puStack_628 = puVar11;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    puStack_6f0 = (uv_process_options_t *)0x1c28c8;
    run_test_spawn_affinity_cold_1();
LAB_001c28c8:
    puStack_6f0 = (uv_process_options_t *)0x1c28d5;
    run_test_spawn_affinity_cold_2();
LAB_001c28d5:
    puStack_6f0 = (uv_process_options_t *)0x1c28e2;
    run_test_spawn_affinity_cold_3();
    puVar9 = __nmemb;
LAB_001c28e2:
    __ptr = __s;
    puStack_6f0 = (uv_process_options_t *)0x1c28e7;
    run_test_spawn_affinity_cold_9();
LAB_001c28e7:
    puStack_6f0 = (uv_process_options_t *)0x1c28ec;
    run_test_spawn_affinity_cold_4();
LAB_001c28ec:
    puStack_6f0 = (uv_process_options_t *)0x1c28f1;
    run_test_spawn_affinity_cold_5();
LAB_001c28f1:
    puStack_6f0 = (uv_process_options_t *)0x1c28f6;
    run_test_spawn_affinity_cold_6();
LAB_001c28f6:
    puStack_6f0 = (uv_process_options_t *)0x1c28fb;
    run_test_spawn_affinity_cold_7();
  }
  else {
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    cStack_6c8.__bits[0xe] = 0;
    cStack_6c8.__bits[0xf] = 0;
    cStack_6c8.__bits[0xc] = 0;
    cStack_6c8.__bits[0xd] = 0;
    cStack_6c8.__bits[10] = 0;
    cStack_6c8.__bits[0xb] = 0;
    cStack_6c8.__bits[8] = 0;
    cStack_6c8.__bits[9] = 0;
    cStack_6c8.__bits[6] = 0;
    cStack_6c8.__bits[7] = 0;
    cStack_6c8.__bits[4] = 0;
    cStack_6c8.__bits[5] = 0;
    cStack_6c8.__bits[2] = 0;
    cStack_6c8.__bits[3] = 0;
    cStack_6c8.__bits[0] = 0;
    cStack_6c8.__bits[1] = 0;
    __s = (uv_process_options_t *)0x0;
    puStack_6f0 = (uv_process_options_t *)0x1c271f;
    iVar1 = sched_getaffinity(0,0x80,&cStack_6c8);
    if (iVar1 != 0) {
      puStack_6f0 = (uv_process_options_t *)0x1c2728;
      piVar10 = __errno_location();
      __s = (uv_process_options_t *)(long)*piVar10;
    }
    puStack_6e8 = (uv_process_options_t *)0x0;
    apuStack_6e0[0] = __s;
    if (__s != (uv_process_options_t *)0x0) goto LAB_001c28c8;
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    puVar9 = (uv_process_options_t *)0x0;
    do {
      if ((puVar9 < (uv_process_options_t *)0x400) &&
         (puVar11 = puVar9,
         (cStack_6c8.__bits[(ulong)puVar9 >> 6] >> ((ulong)puVar9 & 0x3f) & 1) != 0)) break;
      puVar9 = (uv_process_options_t *)((long)&puVar9->exit_cb + 1);
      puVar11 = __nmemb;
    } while (__nmemb != puVar9);
    puVar11 = (uv_process_options_t *)((ulong)puVar11 & 0xffffffff);
    puStack_6e8 = __nmemb;
    apuStack_6e0[0] = puVar11;
    if (__nmemb <= puVar11) goto LAB_001c28d5;
    puStack_6f0 = (uv_process_options_t *)0x1c27a8;
    snprintf((char *)apuStack_6e0,0xb,"%d",puVar11);
    puStack_6f0 = (uv_process_options_t *)0x1c27bb;
    init_process_options("spawn_helper_affinity",exit_cb);
    puStack_6f0 = (uv_process_options_t *)0x1c27c8;
    __ptr = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    puVar9 = __nmemb;
    if (__ptr == (uv_process_options_t *)0x0) goto LAB_001c28e2;
    *(char *)((long)&puVar11->exit_cb + (long)&__ptr->exit_cb) = '\x01';
    puVar9 = &options;
    options.cpumask = (char *)__ptr;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)apuStack_6e0;
    options.args[3] = "dummy";
    puStack_6f0 = (uv_process_options_t *)0x1c2810;
    uVar4 = uv_default_loop();
    puStack_6f0 = (uv_process_options_t *)0x1c2822;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != 0) goto LAB_001c28e7;
    puStack_6f0 = (uv_process_options_t *)0x1c282f;
    uVar4 = uv_default_loop();
    puStack_6f0 = (uv_process_options_t *)0x1c2839;
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_001c28ec;
    if (exit_cb_called != 1) goto LAB_001c28f1;
    if (close_cb_called != 1) goto LAB_001c28f6;
    puStack_6f0 = (uv_process_options_t *)0x1c2863;
    free(__ptr);
    puStack_6f0 = (uv_process_options_t *)0x1c2868;
    puVar9 = (uv_process_options_t *)uv_default_loop();
    puStack_6f0 = (uv_process_options_t *)0x1c287c;
    uv_walk(puVar9,close_walk_cb,0);
    puStack_6f0 = (uv_process_options_t *)0x1c2886;
    uv_run(puVar9,0);
    puStack_6e8 = (uv_process_options_t *)0x0;
    puStack_6f0 = (uv_process_options_t *)0x1c2893;
    uVar4 = uv_default_loop();
    puStack_6f0 = (uv_process_options_t *)0x1c289b;
    iVar1 = uv_loop_close(uVar4);
    puStack_6d0 = (uv_process_options_t *)(long)iVar1;
    if (puStack_6e8 == puStack_6d0) {
      puStack_6f0 = (uv_process_options_t *)0x1c28b2;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_6f0 = (uv_process_options_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  puStack_718 = (uv_process_options_t *)0x1c2912;
  puStack_6f0 = puVar9;
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    puStack_718 = (uv_process_options_t *)0x1c29d1;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29d1:
    puStack_718 = (uv_process_options_t *)0x1c29d6;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29d6:
    puStack_718 = (uv_process_options_t *)0x1c29db;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    puStack_718 = (uv_process_options_t *)0x1c292d;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_701;
    cStack_701 = '\0';
    options.cpumask_size = 0;
    puVar9 = &options;
    puStack_718 = (uv_process_options_t *)0x1c2953;
    uVar4 = uv_default_loop();
    puStack_718 = (uv_process_options_t *)0x1c2965;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != -0x16) goto LAB_001c29d1;
    if (exit_cb_called != 0) goto LAB_001c29d6;
    puStack_718 = (uv_process_options_t *)0x1c2978;
    puVar9 = (uv_process_options_t *)uv_default_loop();
    puStack_718 = (uv_process_options_t *)0x1c298c;
    uv_walk(puVar9,close_walk_cb,0);
    puStack_718 = (uv_process_options_t *)0x1c2996;
    uv_run(puVar9,0);
    lStack_6f8 = 0;
    puStack_718 = (uv_process_options_t *)0x1c29a4;
    uVar4 = uv_default_loop();
    puStack_718 = (uv_process_options_t *)0x1c29ac;
    iVar1 = uv_loop_close(uVar4);
    lStack_700 = (long)iVar1;
    if (lStack_6f8 == lStack_700) {
      puStack_718 = (uv_process_options_t *)0x1c29c4;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_718 = (uv_process_options_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_730 = (uv_process_options_t *)0x1c29fd;
  puStack_718 = puVar9;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_730 = (uv_process_options_t *)0x1c2a02;
  uVar4 = uv_default_loop();
  puStack_730 = (uv_process_options_t *)0x1c2a18;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_720 = (long)iVar1;
  lStack_728 = 0;
  if (lStack_720 == 0) {
    puStack_730 = (uv_process_options_t *)0x1c2a3b;
    uVar4 = uv_default_loop();
    puStack_730 = (uv_process_options_t *)0x1c2a45;
    iVar1 = uv_run(uVar4,0);
    lStack_720 = (long)iVar1;
    lStack_728 = 0;
    if (lStack_720 != 0) goto LAB_001c2b56;
    puStack_730 = (uv_process_options_t *)0x1c2a6f;
    iVar1 = uv_is_closing(&process);
    lStack_720 = (long)iVar1;
    lStack_728 = 0;
    if (lStack_720 != 0) goto LAB_001c2b63;
    puStack_730 = (uv_process_options_t *)0x1c2a9b;
    uv_close(&process,0);
    puStack_730 = (uv_process_options_t *)0x1c2aa0;
    uVar4 = uv_default_loop();
    puStack_730 = (uv_process_options_t *)0x1c2aaa;
    iVar1 = uv_run(uVar4,0);
    lStack_720 = (long)iVar1;
    lStack_728 = 0;
    if (lStack_720 != 0) goto LAB_001c2b70;
    lStack_720 = 1;
    puStack_730 = (uv_process_options_t *)0x1c2add;
    iVar1 = uv_is_closing(&process);
    lStack_728 = (long)iVar1;
    if (lStack_720 != lStack_728) goto LAB_001c2b7d;
    puStack_730 = (uv_process_options_t *)0x1c2af7;
    puVar9 = (uv_process_options_t *)uv_default_loop();
    puStack_730 = (uv_process_options_t *)0x1c2b0b;
    uv_walk(puVar9,close_walk_cb,0);
    puStack_730 = (uv_process_options_t *)0x1c2b15;
    uv_run(puVar9,0);
    lStack_720 = 0;
    puStack_730 = (uv_process_options_t *)0x1c2b23;
    uVar4 = uv_default_loop();
    puStack_730 = (uv_process_options_t *)0x1c2b2b;
    iVar1 = uv_loop_close(uVar4);
    lStack_728 = (long)iVar1;
    if (lStack_720 == lStack_728) {
      puStack_730 = (uv_process_options_t *)0x1c2b41;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_730 = (uv_process_options_t *)0x1c2b56;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b56:
    puStack_730 = (uv_process_options_t *)0x1c2b63;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b63:
    puStack_730 = (uv_process_options_t *)0x1c2b70;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b70:
    puStack_730 = (uv_process_options_t *)0x1c2b7d;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b7d:
    puStack_730 = (uv_process_options_t *)0x1c2b8a;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_730 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_ba0 = 0x6c756e2f7665642f;
  uStack_b98 = 0x6c;
  puStack_740 = puVar9;
  puStack_738 = __ptr;
  puStack_730 = puVar11;
  iVar1 = uv_fs_open(0,auStack_900,&uStack_ba0,2,0,0);
  alStack_9e8[0] = (long)iVar1;
  alStack_ab0[0] = 0;
  if (alStack_9e8[0] == 0) {
    puVar9 = (uv_process_options_t *)(ulong)uStack_8a8;
    uStack_bb8 = uStack_8a8;
    init_process_options("spawn_helper8",exit_cb);
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,(uv_stream_t *)alStack_9e8,0);
    alStack_ab0[0] = (long)iVar1;
    alStack_b78[0] = 0;
    if (alStack_ab0[0] != 0) goto LAB_001c2eb0;
    options.stdio = &uStack_b90;
    uStack_b90.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_b90.data.stream = (uv_stream_t *)alStack_9e8;
    iStack_bb4 = dup(uStack_8a8);
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    alStack_ab0[0] = (long)iVar1;
    alStack_b78[0] = 0;
    if (alStack_ab0[0] != 0) goto LAB_001c2ec2;
    auStack_bb0 = uv_buf_init(&uStack_bb8,4);
    iVar1 = uv_write(alStack_ab0,alStack_9e8,auStack_bb0,1,write_null_cb);
    alStack_b78[0] = (long)iVar1;
    if (alStack_b78[0] != 0) goto LAB_001c2ed4;
    auVar12 = uv_buf_init(&iStack_bb4,4);
    auStack_bb0 = auVar12;
    iVar1 = uv_write(alStack_b78,alStack_9e8,auStack_bb0,1,write_cb);
    lStack_bc0 = 0;
    if (iVar1 != 0) goto LAB_001c2ee3;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    lStack_bc0 = 0;
    if (iVar1 != 0) goto LAB_001c2ef2;
    iVar1 = uv_fs_close(0,auStack_900,uStack_bb8,0);
    lStack_bc0 = 0;
    if (iVar1 != 0) goto LAB_001c2f01;
    lStack_bc0 = (long)exit_cb_called;
    if (lStack_bc0 != 1) goto LAB_001c2f10;
    lStack_bc0 = (long)close_cb_called;
    if (lStack_bc0 != 2) goto LAB_001c2f1f;
    puVar9 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar9,close_walk_cb,0);
    uv_run(puVar9,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    lStack_bc0 = (long)iVar1;
    if (lStack_bc0 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2eb0:
    run_test_spawn_fs_open_cold_2();
LAB_001c2ec2:
    run_test_spawn_fs_open_cold_3();
LAB_001c2ed4:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ee3:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ef2:
    run_test_spawn_fs_open_cold_6();
LAB_001c2f01:
    run_test_spawn_fs_open_cold_7();
LAB_001c2f10:
    run_test_spawn_fs_open_cold_8();
LAB_001c2f1f:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_bc0;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  puStack_bf8 = puVar9;
  auStack_f08._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(auStack_f08 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_c30;
    uStack_c30.flags = UV_INHERIT_FD;
    uStack_c30.data.file = auStack_f08._16_4_;
    uStack_c20 = 0;
    uStack_c10 = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    apuStack_ed8[0] = (uv_handle_t *)(long)iVar1;
    auStack_d18[0] = 0;
    if (apuStack_ed8[0] != (uv_handle_t *)0x0) goto LAB_001c33eb;
    uv_unref(&process);
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,auStack_d18,0);
    apuStack_ed8[0] = (uv_handle_t *)(long)iVar1;
    auStack_f08._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_ed8[0] != (uv_handle_t *)0x0) goto LAB_001c33fd;
    iVar1 = uv_pipe_open(auStack_d18,auStack_f08._16_4_);
    apuStack_ed8[0] = (uv_handle_t *)(long)iVar1;
    auStack_f08._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_ed8[0] != (uv_handle_t *)0x0) goto LAB_001c340c;
    auStack_f08._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(auStack_d18,on_alloc,on_read_once);
    apuStack_ed8[0] = (uv_handle_t *)(long)iVar1;
    auStack_f08._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_ed8[0] != (uv_handle_t *)0x0) goto LAB_001c341b;
    auStack_f08._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_ed8,auStack_f08._20_4_,auStack_f08 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_f08._8_8_ = SEXT48(iVar1);
    if (auStack_f08._0_8_ != auStack_f08._8_8_) goto LAB_001c342a;
    auStack_f08._0_8_ = (uv_loop_t *)0x1;
    auStack_f08._8_8_ = puStack_e80;
    if (puStack_e80 != (uv_loop_t *)0x1) goto LAB_001c3439;
    uv_fs_req_cleanup(apuStack_ed8);
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    auStack_f08._0_8_ = SEXT48(iVar1);
    auStack_f08._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_f08._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3448;
    auStack_f08._0_8_ = (uv_loop_t *)0x1;
    auStack_f08._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_f08._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3457;
    uv_close(auStack_d18,close_cb);
    auStack_f08._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_ed8,auStack_f08._20_4_,auStack_f08 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_f08._8_8_ = SEXT48(iVar1);
    if (auStack_f08._0_8_ != auStack_f08._8_8_) goto LAB_001c3466;
    auStack_f08._0_8_ = (uv_loop_t *)0x1;
    auStack_f08._8_8_ = puStack_e80;
    if (puStack_e80 != (uv_loop_t *)0x1) goto LAB_001c3475;
    uv_fs_req_cleanup(apuStack_ed8);
    uVar4 = uv_default_loop();
    iVar1 = uv_timer_init(uVar4,&timer);
    auStack_f08._0_8_ = SEXT48(iVar1);
    auStack_f08._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_f08._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3484;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_f08._0_8_ = SEXT48(iVar1);
    auStack_f08._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_f08._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3493;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    if (iVar1 == 1) {
      uVar4 = uv_default_loop();
      iVar1 = uv_run(uVar4,1);
      auStack_f08._0_8_ = SEXT48(iVar1);
      auStack_f08._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_f08._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34de;
    }
    auStack_f08._0_8_ = (uv_loop_t *)0x1;
    auStack_f08._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_f08._8_8_ != (uv_loop_t *)0x1) goto LAB_001c34a2;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_f08._0_8_ = SEXT48(iVar1);
    auStack_f08._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_f08._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b1;
    iVar1 = close(auStack_f08._20_4_);
    auStack_f08._0_8_ = SEXT48(iVar1);
    auStack_f08._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_f08._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34c0;
    auStack_f08._20_4_ = -1;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    auStack_f08._0_8_ = (uv_loop_t *)0x0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    auStack_f08._8_8_ = SEXT48(iVar1);
    if (auStack_f08._0_8_ == auStack_f08._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33eb:
    run_test_closed_fd_events_cold_2();
LAB_001c33fd:
    run_test_closed_fd_events_cold_3();
LAB_001c340c:
    run_test_closed_fd_events_cold_4();
LAB_001c341b:
    run_test_closed_fd_events_cold_5();
LAB_001c342a:
    run_test_closed_fd_events_cold_6();
LAB_001c3439:
    run_test_closed_fd_events_cold_7();
LAB_001c3448:
    run_test_closed_fd_events_cold_8();
LAB_001c3457:
    run_test_closed_fd_events_cold_9();
LAB_001c3466:
    run_test_closed_fd_events_cold_10();
LAB_001c3475:
    run_test_closed_fd_events_cold_11();
LAB_001c3484:
    run_test_closed_fd_events_cold_12();
LAB_001c3493:
    run_test_closed_fd_events_cold_13();
LAB_001c34a2:
    run_test_closed_fd_events_cold_15();
LAB_001c34b1:
    run_test_closed_fd_events_cold_16();
LAB_001c34c0:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34de:
  tcp = (uv_stream_t *)auStack_f08;
  puVar5 = auStack_f08 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)puVar5,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_same_stdout_stderr) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[3];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_OK(strcmp(output, "TEST"));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}